

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA>::eval_exc_vxc_unpolar_impl
               (double rho,double *eps,double *vrho)

{
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double t154;
  double t152;
  double t151;
  double t149;
  double t143;
  double t137;
  double t135;
  double t134;
  double t133;
  double t131;
  double t127;
  double t124;
  double t123;
  double t122;
  double t121;
  double t117;
  double t114;
  double t112;
  double t107;
  double t106;
  double t104;
  double t103;
  double t102;
  double t101;
  double t99;
  double t96;
  double t89;
  double t85;
  double t84;
  double t80;
  double t79;
  double t78;
  double t63;
  double t56;
  double t49;
  double t47;
  double t45;
  double t44;
  double t43;
  double t39;
  double t38;
  double t37;
  double t34;
  double t30;
  double t22;
  double t21;
  double t15;
  double t12;
  double t11;
  double t10;
  double t94;
  double t87;
  double t77;
  double t72;
  double t69;
  double t65;
  double t64;
  double t60;
  double t59;
  double t57;
  double t36;
  double t29;
  double t26;
  double t19;
  double t18;
  double t17;
  double t9;
  double t8;
  double t4;
  double t2;
  double t1;
  double t52;
  double t7;
  double t6;
  double t3;
  double in_stack_fffffffffffffd88;
  double in_stack_fffffffffffffd90;
  
  dVar1 = safe_math::cbrt<double>(9.62119229494597e-318);
  dVar2 = (1.0 / dVar1) * 1.720508027656199;
  dVar3 = (dVar2 * 0.30820873317469316) / 4.0 + 1.0;
  dVar4 = safe_math::sqrt<double>(9.62193833407119e-318);
  dVar5 = pow_3_2<double>(in_stack_fffffffffffffd90);
  dVar6 = safe_math::pow<double,double>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  dVar7 = dVar5 * 0.204775 + (dVar4 * 7.5957) / 2.0 + (dVar2 * 5.1742145584348584) / 4.0 +
          dVar6 * 0.49294;
  dVar8 = safe_math::log<double>(9.62336124313122e-318);
  dVar9 = dVar3 * 0.031091 * dVar8;
  dVar10 = safe_math::cbrt<double>(9.62364286054935e-318);
  dVar10 = piecewise_functor_3<double>(false,dVar10 * 1e-15,1.0);
  dVar10 = (dVar10 + dVar10 + -2.0) / 0.5198420997897464;
  dVar11 = (dVar2 * 0.16045026469669918) / 4.0 + 1.0;
  dVar12 = safe_math::pow<double,double>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  dVar2 = dVar5 * 0.1100325 + (dVar4 * 10.357) / 2.0 + (dVar2 * 5.225414418180771) / 4.0 +
          dVar12 * 0.49671;
  dVar5 = safe_math::log<double>(9.62548078475188e-318);
  dVar13 = dVar10 * 0.016887 * dVar11 * dVar5 * 0.5848223397455204;
  dVar1 = (1.0 / dVar1) / in_XMM0_Qa;
  dVar14 = dVar1 * 1.720508027656199;
  dVar15 = safe_math::sqrt<double>(9.62705685416211e-318);
  *in_RDI = dVar13 * 2.0 - (dVar9 + dVar9);
  *in_RSI = in_XMM0_Qa *
            ((((dVar1 * 0.016486798667810512 * dVar8) / 6.0 +
              dVar3 * (1.0 / (dVar7 * dVar7)) *
              ((-(dVar15 * 1.6382 * 1.4422495703074083 * 0.0625) * dVar14 +
               ((-((1.0 / dVar4) * 7.5957 * 1.4422495703074083) * dVar14) / 12.0 -
               (dVar14 * 5.1742145584348584) / 12.0)) -
              (dVar6 * 0.49294 * 2.0 * (1.0 / in_XMM0_Qa)) / 3.0) *
              (1.0 / ((32.16364864430221 / dVar7) / 2.0 + 1.0))) -
             (dVar10 * 0.016887 * 0.11125 * 1.4422495703074083 * 1.720508027656199 * dVar1 * dVar5 *
             0.5848223397455204) / 6.0) -
            dVar10 * dVar11 * (1.0 / (dVar2 * dVar2)) *
            ((-(dVar15 * 0.88026 * 1.4422495703074083 * 0.0625) * dVar14 +
             ((-((1.0 / dVar4) * 10.357 * 1.4422495703074083) * dVar14) / 12.0 -
             (dVar14 * 5.225414418180771) / 12.0)) -
            (dVar12 * 0.49671 * 2.0 * (1.0 / in_XMM0_Qa)) / 3.0) *
            (1.0 / ((59.217149286433354 / dVar2) / 2.0 + 1.0)) * 0.5848223397455204) +
            (dVar13 * 2.0 - (dVar9 + dVar9));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double& eps, double& vrho ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t52 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t17 = 0.1e1 / t1;
    constexpr double t18 = beta1_0;
    constexpr double t19 = t3 * t6;
    constexpr double t26 = beta2_0 * t3;
    constexpr double t29 = beta3_0;
    constexpr double t36 = pp_0 + 0.1e1;
    constexpr double t57 = a_2;
    constexpr double t59 = alpha1_2;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = 0.1e1 / t57;
    constexpr double t65 = beta1_2;
    constexpr double t69 = beta2_2 * t3;
    constexpr double t72 = beta3_2;
    constexpr double t77 = pp_2 + 0.1e1;
    constexpr double t87 = 0.1e1 / fz20;
    constexpr double t94 = t1 * t2 * t3;


    const double t10 = safe_math::cbrt( rho );
    const double t11 = 0.1e1 / t10;
    const double t12 = t9 * t11;
    const double t15 = 0.1e1 + t4 * t12 / 0.4e1;
    const double t21 = t19 * t8 * t11;
    const double t22 = safe_math::sqrt( t21 );
    const double t30 = pow_3_2( t21 );
    const double t34 = t21 / 0.4e1;
    const double t37 = safe_math::pow( t34, t36 );
    const double t38 = beta4_0 * t37;
    const double t39 = t18 * t22 / 0.2e1 + t26 * t12 / 0.4e1 + 0.125e0 * t29 * t30 + t38;
    const double t43 = 0.1e1 + t17 / t39 / 0.2e1;
    const double t44 = safe_math::log( t43 );
    const double t45 = t1 * t15 * t44;
    const double t47 = safe_math::cbrt( zeta_tol );
    const double t49 = piecewise_functor_3( 0.1e1 <= zeta_tol, t47 * zeta_tol, 1.0 );
    const double t56 = ( 0.2e1 * t49 - 0.2e1 ) / ( 0.2e1 * t52 - 0.2e1 );
    const double t63 = 0.1e1 + t60 * t12 / 0.4e1;
    const double t78 = safe_math::pow( t34, t77 );
    const double t79 = beta4_2 * t78;
    const double t80 = t65 * t22 / 0.2e1 + t69 * t12 / 0.4e1 + 0.125e0 * t72 * t30 + t79;
    const double t84 = 0.1e1 + t64 / t80 / 0.2e1;
    const double t85 = safe_math::log( t84 );
    const double t89 = t56 * t57 * t63 * t85 * t87;
    const double t96 = 0.1e1 / t10 / rho;
    const double t99 = t94 * t9 * t96 * t44;
    const double t101 = t39 * t39;
    const double t102 = 0.1e1 / t101;
    const double t103 = t15 * t102;
    const double t104 = 0.1e1 / t22;
    const double t106 = t18 * t104 * t3;
    const double t107 = t9 * t96;
    const double t112 = safe_math::sqrt( t21 );
    const double t114 = t29 * t112 * t3;
    const double t117 = 0.1e1 / rho;
    const double t121 = -t106 * t107 / 0.12e2 - t26 * t107 / 0.12e2 - 0.625e-1 * t114 * t107 - t38 * t36 * t117 / 0.3e1;
    const double t122 = 0.1e1 / t43;
    const double t123 = t121 * t122;
    const double t124 = t103 * t123;
    const double t127 = t56 * t57 * t59 * t3;
    const double t131 = t127 * t9 * t96 * t85 * t87;
    const double t133 = t56 * t63;
    const double t134 = t80 * t80;
    const double t135 = 0.1e1 / t134;
    const double t137 = t65 * t104 * t3;
    const double t143 = t72 * t112 * t3;
    const double t149 = -t137 * t107 / 0.12e2 - t69 * t107 / 0.12e2 - 0.625e-1 * t143 * t107 - t79 * t77 * t117 / 0.3e1;
    const double t151 = 0.1e1 / t84;
    const double t152 = t151 * t87;
    const double t154 = t133 * t135 * t149 * t152;


    eps = -0.2e1 * t45 + 0.2e1 * t89;
    vrho = -0.2e1 * t45 + 0.2e1 * t89 + rho * ( t99 / 0.6e1 + t124 - t131 / 0.6e1 - t154 );

  }